

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O3

void cram_index_free(cram_fd *fd)

{
  cram_index *__ptr;
  long lVar1;
  long lVar2;
  
  __ptr = fd->index;
  if (__ptr != (cram_index *)0x0) {
    if (0 < fd->index_sz) {
      lVar1 = 0;
      lVar2 = 0;
      do {
        cram_index_free_recurse((cram_index *)((long)&fd->index->nslice + lVar1));
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x30;
      } while (lVar2 < fd->index_sz);
      __ptr = fd->index;
    }
    free(__ptr);
    fd->index = (cram_index *)0x0;
  }
  return;
}

Assistant:

void cram_index_free(cram_fd *fd) {
    int i;

    if (!fd->index)
	return;
    
    for (i = 0; i < fd->index_sz; i++) {
	cram_index_free_recurse(&fd->index[i]);
    }
    free(fd->index);

    fd->index = NULL;
}